

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_mip_filter_name(crn_mip_filter f)

{
  crn_mip_filter f_local;
  char *local_8;
  
  switch(f) {
  case cCRNMipFilterBox:
    local_8 = "box";
    break;
  case cCRNMipFilterTent:
    local_8 = "tent";
    break;
  case cCRNMipFilterLanczos4:
    local_8 = "lanczos4";
    break;
  case cCRNMipFilterMitchell:
    local_8 = "mitchell";
    break;
  case cCRNMipFilterKaiser:
    local_8 = "kaiser";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* crn_get_mip_filter_name(crn_mip_filter f) {
  switch (f) {
    case cCRNMipFilterBox:
      return "box";
    case cCRNMipFilterTent:
      return "tent";
    case cCRNMipFilterLanczos4:
      return "lanczos4";
    case cCRNMipFilterMitchell:
      return "mitchell";
    case cCRNMipFilterKaiser:
      return "kaiser";
    default:
      break;
  }
  return "?";
}